

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

unsigned_long TJBUFSIZE(int width,int height)

{
  long in_FS_OFFSET;
  
  if (width < 1 || height < 1) {
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc2),"nvalid a",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xba),"rgument",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"TJBUFSIZ",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"E(): Inv",8);
    return 0xffffffffffffffff;
  }
  return (ulong)((height + 0xfU & 0xffffff0) * (width + 0xfU & 0x7ffffff0)) * 6 + 0x800;
}

Assistant:

DLLEXPORT unsigned long TJBUFSIZE(int width, int height)
{
  unsigned long long retval = 0;

  if (width < 1 || height < 1)
    THROWG("TJBUFSIZE(): Invalid argument");

  /* This allows for rare corner cases in which a JPEG image can actually be
     larger than the uncompressed input (we wouldn't mention it if it hadn't
     happened before.) */
  retval = PAD(width, 16) * PAD(height, 16) * 6ULL + 2048ULL;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("TJBUFSIZE(): Image is too large");

bailout:
  return (unsigned long)retval;
}